

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O1

WebPInfoStatus ParseLossyHeader(ChunkData *chunk_data,WebPInfo *webp_info)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  WebPInfoStatus WVar4;
  ulong uVar5;
  ulong uVar6;
  WebPInfo *pWVar7;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  uint3 *puVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  byte *pbVar17;
  bool bVar18;
  int dq_uv_ac;
  int dq_uv_dc;
  int dq_y2_ac;
  int dq_y2_dc;
  int dq_y1_dc;
  uint64_t local_80;
  size_t local_78;
  byte *local_70;
  uint local_64;
  ulong local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  WebPInfo *local_38;
  
  local_78 = chunk_data->size_;
  pbVar17 = chunk_data->payload_;
  bVar3 = *pbVar17;
  bVar1 = pbVar17[1];
  bVar2 = pbVar17[2];
  uVar12 = bVar3 >> 1 & 7;
  local_80 = 0;
  puts("  Parsing lossy bitstream...");
  if (uVar12 < 4) {
    if ((bVar3 & 0x10) == 0) {
      WVar4 = WEBP_INFO_BITSTREAM_ERROR;
      if (webp_info->show_diagnosis_ != 0) {
        ParseLossyHeader_cold_9();
      }
    }
    else {
      uVar8 = ((uint)bVar2 << 0x10 | (uint)bVar1 << 8 | (uint)bVar3) >> 5;
      pcVar9 = "No";
      if ((bVar3 & 1) == 0) {
        pcVar9 = "Yes";
      }
      printf("  Key frame:        %s\n  Profile:          %d\n  Display:          %s\n  Part. 0 length:   %d\n"
             ,pcVar9,(ulong)uVar12,"Yes",(ulong)uVar8);
      if ((bVar3 & 1) == 0) {
        if (((pbVar17[3] == 0x9d) && (pbVar17[4] == 1)) && (pbVar17[5] == 0x2a)) {
          printf("  Width:            %d\n  X scale:          %d\n  Height:           %d\n  Y scale:          %d\n"
                 ,(ulong)((pbVar17[7] & 0x3f) << 8 | (uint)pbVar17[6]),(ulong)(pbVar17[7] >> 6),
                 (ulong)((pbVar17[9] & 0x3f) << 8 | (uint)pbVar17[8]),(ulong)(pbVar17[9] >> 6));
          uVar14 = local_78 - 0x12;
          local_40 = (ulong)uVar8;
          local_60 = uVar14 - local_40;
          if (uVar14 < local_40 || local_60 == 0) {
            WVar4 = WEBP_INFO_BITSTREAM_ERROR;
            if (webp_info->show_diagnosis_ != 0) {
              ParseLossyHeader_cold_3();
            }
          }
          else {
            pbVar17 = pbVar17 + 10;
            bVar3 = *pbVar17;
            local_80 = 2;
            printf("  Color space:      %d\n",(ulong)(bVar3 >> 7));
            printf("  Clamp type:       %d\n",(ulong)(bVar3 >> 6 & 1));
            WVar4 = ParseLossySegmentHeader(webp_info,pbVar17,uVar14,&local_80);
            if ((WVar4 == WEBP_INFO_OK) &&
               (WVar4 = ParseLossyFilterHeader(webp_info,pbVar17,uVar14,&local_80),
               WVar4 == WEBP_INFO_OK)) {
              puVar11 = (uint3 *)(pbVar17 + local_40);
              uVar13 = local_80 + 2;
              bVar3 = 0;
              lVar10 = -2;
              do {
                uVar6 = local_80 >> 3;
                if (uVar14 <= uVar6) {
                  uVar13 = local_80 + 1;
                  break;
                }
                bVar3 = bVar3 * '\x02' - ((char)(pbVar17[uVar6] << ((byte)local_80 & 7)) >> 7);
                local_80 = local_80 + 1;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 0);
              local_80 = uVar13;
              if (uVar6 < uVar14) {
                local_64 = 1 << (bVar3 & 0x1f);
                WVar4 = WEBP_INFO_TRUNCATED_DATA;
                iVar16 = (3 << (bVar3 & 0x1f)) + -3;
                local_70 = pbVar17;
                if ((int)local_60 < iVar16) {
                  if (webp_info->show_diagnosis_ != 0) {
                    ParseLossyHeader_cold_8();
                  }
                }
                else {
                  local_78 = uVar14;
                  printf("  Total partitions: %d\n",(ulong)local_64);
                  pWVar7 = webp_info;
                  if (1 < (int)local_64) {
                    uVar14 = local_60 - (long)iVar16;
                    uVar6 = 1;
                    uVar12 = local_64;
                    local_38 = webp_info;
                    do {
                      uVar15 = (ulong)*puVar11;
                      uVar5 = uVar14;
                      if (uVar14 < uVar15) {
                        if (pWVar7->show_diagnosis_ != 0) {
                          local_60 = uVar14;
                          ParseLossyHeader_cold_5();
                          uVar5 = local_60;
                          uVar14 = local_60;
                          uVar12 = local_64;
                        }
                      }
                      else {
                        local_60 = uVar14 - uVar15;
                        printf("  Part. %d length:   %d\n",uVar6,uVar15);
                        puVar11 = (uint3 *)((long)puVar11 + 3);
                        pWVar7 = local_38;
                        uVar14 = local_60;
                        uVar12 = local_64;
                      }
                      if (uVar5 < uVar15) goto LAB_00104932;
                      uVar8 = (int)uVar6 + 1;
                      uVar6 = (ulong)uVar8;
                    } while (uVar12 != uVar8);
                  }
                  uVar12 = 0;
                  local_44 = 0;
                  local_48 = 0;
                  local_4c = 0;
                  local_50 = 0;
                  local_54 = 0;
                  local_80 = uVar13 + 7;
                  lVar10 = -7;
                  do {
                    uVar14 = uVar13 >> 3;
                    if (local_78 <= uVar14) {
                      local_80 = uVar13 + 1;
                      break;
                    }
                    uVar12 = (uint)((byte)(local_70[uVar14] << ((byte)uVar13 & 7)) >> 7) +
                             uVar12 * 2;
                    uVar13 = uVar13 + 1;
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 0);
                  if (uVar14 < local_78) {
                    uVar14 = local_80 >> 3;
                    bVar18 = true;
                    if (uVar14 < local_78) {
                      bVar18 = -1 < (char)(local_70[uVar14] << ((byte)local_80 & 7));
                    }
                    local_80 = local_80 + 1;
                    if ((uVar14 < local_78) &&
                       ((bVar18 ||
                        (iVar16 = GetSignedBits(local_70,local_78,4,(int *)&local_44,&local_80),
                        iVar16 != 0)))) {
                      uVar14 = local_80 >> 3;
                      bVar18 = true;
                      if (uVar14 < local_78) {
                        bVar18 = -1 < (char)(local_70[uVar14] << ((byte)local_80 & 7));
                      }
                      local_80 = local_80 + 1;
                      if ((uVar14 < local_78) &&
                         ((bVar18 ||
                          (iVar16 = GetSignedBits(local_70,local_78,4,(int *)&local_48,&local_80),
                          iVar16 != 0)))) {
                        uVar14 = local_80 >> 3;
                        bVar18 = true;
                        if (uVar14 < local_78) {
                          bVar18 = -1 < (char)(local_70[uVar14] << ((byte)local_80 & 7));
                        }
                        local_80 = local_80 + 1;
                        if ((uVar14 < local_78) &&
                           ((bVar18 ||
                            (iVar16 = GetSignedBits(local_70,local_78,4,(int *)&local_4c,&local_80),
                            iVar16 != 0)))) {
                          uVar14 = local_80 >> 3;
                          bVar18 = true;
                          if (uVar14 < local_78) {
                            bVar18 = -1 < (char)(local_70[uVar14] << ((byte)local_80 & 7));
                          }
                          local_80 = local_80 + 1;
                          if ((uVar14 < local_78) &&
                             ((bVar18 ||
                              (iVar16 = GetSignedBits(local_70,local_78,4,(int *)&local_50,&local_80
                                                     ), iVar16 != 0)))) {
                            uVar14 = local_80 >> 3;
                            bVar18 = true;
                            if (uVar14 < local_78) {
                              bVar18 = -1 < (char)(local_70[uVar14] << ((byte)local_80 & 7));
                            }
                            local_80 = local_80 + 1;
                            if ((uVar14 < local_78) &&
                               ((bVar18 ||
                                (iVar16 = GetSignedBits(local_70,local_78,4,(int *)&local_54,
                                                        &local_80), iVar16 != 0)))) {
                              printf("  Base Q:           %d\n",(ulong)uVar12);
                              printf("  DQ Y1 DC:         %d\n",(ulong)local_44);
                              printf("  DQ Y2 DC:         %d\n",(ulong)local_48);
                              printf("  DQ Y2 AC:         %d\n",(ulong)local_4c);
                              printf("  DQ UV DC:         %d\n",(ulong)local_50);
                              printf("  DQ UV AC:         %d\n",(ulong)local_54);
                              if (local_80 >> 3 < local_40) {
                                return WEBP_INFO_OK;
                              }
                              if (webp_info->show_diagnosis_ == 0) {
                                return WEBP_INFO_TRUNCATED_DATA;
                              }
                              ParseLossyHeader_cold_7();
                              return WEBP_INFO_TRUNCATED_DATA;
                            }
                          }
                        }
                      }
                    }
                    iVar16 = webp_info->show_diagnosis_;
                  }
                  else {
                    iVar16 = pWVar7->show_diagnosis_;
                  }
                  if (iVar16 != 0) {
                    ParseLossyHeader_cold_6();
                  }
LAB_00104932:
                  WVar4 = WEBP_INFO_TRUNCATED_DATA;
                }
              }
              else {
                WVar4 = WEBP_INFO_TRUNCATED_DATA;
                if (webp_info->show_diagnosis_ != 0) {
                  ParseLossyHeader_cold_4();
                }
              }
            }
          }
        }
        else {
          WVar4 = WEBP_INFO_BITSTREAM_ERROR;
          if (webp_info->show_diagnosis_ != 0) {
            ParseLossyHeader_cold_2();
          }
        }
      }
      else {
        WVar4 = WEBP_INFO_BITSTREAM_ERROR;
        if (webp_info->show_diagnosis_ != 0) {
          ParseLossyHeader_cold_1();
        }
      }
    }
  }
  else {
    WVar4 = WEBP_INFO_BITSTREAM_ERROR;
    if (webp_info->show_diagnosis_ != 0) {
      ParseLossyHeader_cold_10();
    }
  }
  return WVar4;
}

Assistant:

static WebPInfoStatus ParseLossyHeader(const ChunkData* const chunk_data,
                                       const WebPInfo* const webp_info) {
  const uint8_t* data = chunk_data->payload_;
  size_t data_size = chunk_data->size_ - CHUNK_HEADER_SIZE;
  const uint32_t bits = (uint32_t)data[0] | (data[1] << 8) | (data[2] << 16);
  const int key_frame = !(bits & 1);
  const int profile = (bits >> 1) & 7;
  const int display = (bits >> 4) & 1;
  const uint32_t partition0_length = (bits >> 5);
  WebPInfoStatus status = WEBP_INFO_OK;
  uint64_t bit_position = 0;
  uint64_t* const bit_pos = &bit_position;
  int colorspace, clamp_type;
  printf("  Parsing lossy bitstream...\n");
  // Calling WebPGetFeatures() in ProcessImageChunk() should ensure this.
  assert(chunk_data->size_ >= CHUNK_HEADER_SIZE + 10);
  if (profile > 3) {
    LOG_ERROR("Unknown profile.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  if (!display) {
    LOG_ERROR("Frame is not displayable.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  data += 3;
  data_size -= 3;
  printf("  Key frame:        %s\n"
         "  Profile:          %d\n"
         "  Display:          %s\n"
         "  Part. 0 length:   %d\n",
         key_frame ? "Yes" : "No", profile,
         display ? "Yes" : "No", partition0_length);
  if (key_frame) {
    if (!(data[0] == 0x9d && data[1] == 0x01 && data[2] == 0x2a)) {
      LOG_ERROR("Invalid lossy bitstream signature.");
      return WEBP_INFO_BITSTREAM_ERROR;
    }
    printf("  Width:            %d\n"
           "  X scale:          %d\n"
           "  Height:           %d\n"
           "  Y scale:          %d\n",
           ((data[4] << 8) | data[3]) & 0x3fff, data[4] >> 6,
           ((data[6] << 8) | data[5]) & 0x3fff, data[6] >> 6);
    data += 7;
    data_size -= 7;
  } else {
    LOG_ERROR("Non-keyframe detected in lossy bitstream.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  if (partition0_length >= data_size) {
    LOG_ERROR("Bad partition length.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  GET_BITS(colorspace, 1);
  GET_BITS(clamp_type, 1);
  printf("  Color space:      %d\n", colorspace);
  printf("  Clamp type:       %d\n", clamp_type);
  status = ParseLossySegmentHeader(webp_info, data, data_size, bit_pos);
  if (status != WEBP_INFO_OK) return status;
  status = ParseLossyFilterHeader(webp_info, data, data_size, bit_pos);
  if (status != WEBP_INFO_OK) return status;
  {  // Partition number and size.
    const uint8_t* part_size = data + partition0_length;
    int num_parts, i;
    size_t part_data_size;
    GET_BITS(num_parts, 2);
    num_parts = 1 << num_parts;
    if ((int)(data_size - partition0_length) < (num_parts - 1) * 3) {
      LOG_ERROR("Truncated lossy bitstream.");
      return WEBP_INFO_TRUNCATED_DATA;
    }
    part_data_size = data_size - partition0_length - (num_parts - 1) * 3;
    printf("  Total partitions: %d\n", num_parts);
    for (i = 1; i < num_parts; ++i) {
      const size_t psize =
          part_size[0] | (part_size[1] << 8) | (part_size[2] << 16);
      if (psize > part_data_size) {
        LOG_ERROR("Truncated partition.");
        return WEBP_INFO_TRUNCATED_DATA;
      }
      printf("  Part. %d length:   %d\n", i, (int)psize);
      part_data_size -= psize;
      part_size += 3;
    }
  }
  // Quantizer.
  {
    int base_q, bit;
    int dq_y1_dc = 0, dq_y2_dc = 0, dq_y2_ac = 0, dq_uv_dc = 0, dq_uv_ac = 0;
    GET_BITS(base_q, 7);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_y1_dc, 4);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_y2_dc, 4);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_y2_ac, 4);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_uv_dc, 4);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_uv_ac, 4);
    printf("  Base Q:           %d\n", base_q);
    printf("  DQ Y1 DC:         %d\n", dq_y1_dc);
    printf("  DQ Y2 DC:         %d\n", dq_y2_dc);
    printf("  DQ Y2 AC:         %d\n", dq_y2_ac);
    printf("  DQ UV DC:         %d\n", dq_uv_dc);
    printf("  DQ UV AC:         %d\n", dq_uv_ac);
  }
  if ((*bit_pos >> 3) >= partition0_length) {
    LOG_ERROR("Truncated lossy bitstream.");
    return WEBP_INFO_TRUNCATED_DATA;
  }
  return WEBP_INFO_OK;
}